

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcInse.c
# Opt level: O1

int Gia_ManInseHighestScore(Gia_Man_t *p,int *pCost)

{
  int iVar1;
  Vec_Int_t *pVVar2;
  void *pvVar3;
  int *__ptr;
  uint uVar4;
  int iVar5;
  int iVar6;
  ulong uVar7;
  long lVar8;
  int iVar9;
  ulong uVar10;
  size_t __nmemb;
  ulong uVar11;
  long lVar12;
  long lVar13;
  
  iVar9 = p->iData;
  lVar13 = (long)iVar9;
  __nmemb = lVar13 << 6;
  __ptr = (int *)calloc(__nmemb,4);
  iVar1 = p->nRegs;
  if (0 < (long)iVar1) {
    pVVar2 = p->vCos;
    iVar6 = pVVar2->nSize;
    lVar12 = 0;
    do {
      uVar4 = (iVar6 - iVar1) + (int)lVar12;
      if (((int)uVar4 < 0) || (iVar6 <= (int)uVar4)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar5 = pVVar2->pArray[uVar4];
      if ((iVar5 < 0) || (p->nObjs <= iVar5)) {
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      if (0 < iVar9) {
        iVar5 = iVar5 * iVar9 * 2;
        pvVar3 = p->pData;
        lVar8 = 0;
        do {
          uVar10 = *(ulong *)((long)pvVar3 + lVar8 * 8 + (long)iVar5 * 8);
          uVar7 = 0;
          do {
            uVar4 = 1;
            if ((uVar10 >> (uVar7 & 0x3f) & 1) == 0) {
              uVar4 = (uint)((*(ulong *)((long)pvVar3 + lVar8 * 8 + lVar13 * 8 + (long)iVar5 * 8) &
                             1L << ((byte)uVar7 & 0x3f)) != 0);
            }
            __ptr[(ulong)((uint)lVar8 & 0x3ffffff) * 0x40 + uVar7] =
                 __ptr[(ulong)((uint)lVar8 & 0x3ffffff) * 0x40 + uVar7] + uVar4;
            uVar7 = uVar7 + 1;
          } while (uVar7 != 0x40);
          lVar8 = lVar8 + 1;
        } while (lVar8 != lVar13);
      }
      lVar12 = lVar12 + 1;
    } while (lVar12 != iVar1);
  }
  iVar6 = *__ptr;
  if (iVar9 < 1) {
    iVar9 = 0;
  }
  else {
    uVar10 = 2;
    if (2 < (int)__nmemb) {
      uVar10 = __nmemb & 0xffffffff;
    }
    uVar7 = 0;
    uVar11 = 1;
    iVar5 = iVar6;
    do {
      iVar9 = __ptr[uVar11];
      iVar6 = iVar5;
      if (iVar5 <= iVar9) {
        iVar6 = iVar9;
      }
      if (iVar5 < iVar9) {
        uVar7 = uVar11 & 0xffffffff;
      }
      iVar9 = (int)uVar7;
      uVar11 = uVar11 + 1;
      iVar5 = iVar6;
    } while (uVar10 != uVar11);
  }
  *pCost = iVar1 - iVar6;
  free(__ptr);
  return iVar9;
}

Assistant:

int Gia_ManInseHighestScore( Gia_Man_t * p, int * pCost )
{
    Gia_Obj_t * pObj;
    word * pData0, * pData1;
    int * pCounts, CountBest;
    int i, k, b, nPats, iPat;
    nPats = 64 * p->iData;
    pCounts = ABC_CALLOC( int, nPats );
    Gia_ManForEachRi( p, pObj, k )
    {
        pData0 = Gia_ParTestObj( p, Gia_ObjId(p, pObj) );
        pData1 = pData0 + p->iData;
        for ( i = 0; i < p->iData; i++ )
            for ( b = 0; b < 64; b++ )
                pCounts[64*i+b] += (((pData0[i] >> b) & 1) || ((pData1[i] >> b) & 1)); // binary
    }
    iPat = 0;
    CountBest = pCounts[0]; 
    for ( k = 1; k < nPats; k++ )
        if ( CountBest < pCounts[k] )
            CountBest = pCounts[k], iPat = k;
    *pCost = Gia_ManRegNum(p) - CountBest; // ternary
    ABC_FREE( pCounts );
    return iPat;
}